

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void av1_highbd_iwht4x4_16_add_sse4_1(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  long lVar1;
  short *psVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  short sVar10;
  ushort uVar11;
  short sVar12;
  ushort uVar13;
  int iVar14;
  short sVar15;
  ushort uVar16;
  short sVar17;
  ushort uVar18;
  int iVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  int iVar24;
  short sVar25;
  ushort uVar26;
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar28 [16];
  int iVar33;
  undefined1 auVar32 [16];
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  int iVar42;
  int iVar44;
  int iVar45;
  int iVar46;
  undefined1 auVar43 [16];
  int iVar47;
  int iVar48;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar49 [16];
  
  iVar9 = (*input >> 2) + (input[4] >> 2);
  iVar14 = (input[1] >> 2) + (input[5] >> 2);
  iVar19 = (input[2] >> 2) + (input[6] >> 2);
  iVar24 = (input[3] >> 2) + (input[7] >> 2);
  iVar27 = (input[8] >> 2) - (input[0xc] >> 2);
  iVar29 = (input[9] >> 2) - (input[0xd] >> 2);
  iVar30 = (input[10] >> 2) - (input[0xe] >> 2);
  iVar31 = (input[0xb] >> 2) - (input[0xf] >> 2);
  iVar42 = iVar9 - iVar27 >> 1;
  iVar44 = iVar14 - iVar29 >> 1;
  iVar45 = iVar19 - iVar30 >> 1;
  iVar46 = iVar24 - iVar31 >> 1;
  iVar47 = iVar42 - (input[0xc] >> 2);
  iVar50 = iVar44 - (input[0xd] >> 2);
  iVar51 = iVar45 - (input[0xe] >> 2);
  iVar53 = iVar46 - (input[0xf] >> 2);
  iVar14 = iVar14 - iVar50;
  iVar24 = iVar24 - iVar53;
  iVar42 = iVar42 - (input[4] >> 2);
  iVar44 = iVar44 - (input[5] >> 2);
  iVar45 = iVar45 - (input[6] >> 2);
  iVar46 = iVar46 - (input[7] >> 2);
  iVar29 = iVar29 + iVar44;
  iVar31 = iVar31 + iVar46;
  iVar9 = (iVar9 - iVar47) + iVar14;
  iVar47 = iVar47 + iVar50;
  iVar33 = iVar42 + iVar44;
  iVar27 = iVar27 + iVar42 + iVar29;
  iVar48 = (iVar19 - iVar51) - iVar24;
  iVar51 = iVar51 - iVar53;
  iVar52 = iVar45 - iVar46;
  iVar54 = (iVar30 + iVar45) - iVar31;
  iVar19 = iVar9 - iVar48 >> 1;
  iVar30 = iVar47 - iVar51 >> 1;
  iVar42 = iVar33 - iVar52 >> 1;
  iVar45 = iVar27 - iVar54 >> 1;
  auVar28._0_4_ = iVar19 - iVar14;
  auVar28._4_4_ = iVar30 - iVar50;
  auVar28._8_4_ = iVar42 - iVar44;
  auVar28._12_4_ = iVar45 - iVar29;
  auVar49._0_4_ = iVar48 + auVar28._0_4_;
  auVar49._4_4_ = iVar51 + auVar28._4_4_;
  auVar49._8_4_ = iVar52 + auVar28._8_4_;
  auVar49._12_4_ = iVar54 + auVar28._12_4_;
  auVar43._0_4_ = iVar19 - iVar24;
  auVar43._4_4_ = iVar30 - iVar53;
  auVar43._8_4_ = iVar42 - iVar46;
  auVar43._12_4_ = iVar45 - iVar31;
  auVar32._0_4_ = iVar9 - auVar43._0_4_;
  auVar32._4_4_ = iVar47 - auVar43._4_4_;
  auVar32._8_4_ = iVar33 - auVar43._8_4_;
  auVar32._12_4_ = iVar27 - auVar43._12_4_;
  auVar32 = packssdw(auVar32,auVar43);
  auVar28 = packssdw(auVar28,auVar49);
  uVar4 = *(undefined8 *)((long)stride * 2 + (long)dest8 * 2);
  uVar5 = *(undefined8 *)((long)dest8 * 2);
  sVar7 = (short)uVar5 + auVar32._0_2_;
  sVar10 = (short)((ulong)uVar5 >> 0x10) + auVar32._2_2_;
  sVar12 = (short)((ulong)uVar5 >> 0x20) + auVar32._4_2_;
  sVar15 = (short)((ulong)uVar5 >> 0x30) + auVar32._6_2_;
  sVar17 = (short)uVar4 + auVar32._8_2_;
  sVar20 = (short)((ulong)uVar4 >> 0x10) + auVar32._10_2_;
  sVar22 = (short)((ulong)uVar4 >> 0x20) + auVar32._12_2_;
  sVar25 = (short)((ulong)uVar4 >> 0x30) + auVar32._14_2_;
  lVar6 = (long)(stride * 2) * 2;
  lVar3 = (long)(stride * 3) * 2;
  uVar4 = *(undefined8 *)(lVar6 + (long)dest8 * 2);
  uVar5 = *(undefined8 *)(lVar3 + (long)dest8 * 2);
  auVar32 = pmovsxbw(auVar43,0x101010101010101);
  auVar32 = psllw(auVar32,ZEXT416((uint)bd));
  sVar34 = auVar32._0_2_ + -1;
  sVar35 = auVar32._2_2_ + -1;
  sVar36 = auVar32._4_2_ + -1;
  sVar37 = auVar32._6_2_ + -1;
  sVar38 = auVar32._8_2_ + -1;
  sVar39 = auVar32._10_2_ + -1;
  sVar40 = auVar32._12_2_ + -1;
  sVar41 = auVar32._14_2_ + -1;
  uVar8 = (ushort)(sVar34 < sVar7) * sVar34 | (ushort)(sVar34 >= sVar7) * sVar7;
  uVar11 = (ushort)(sVar35 < sVar10) * sVar35 | (ushort)(sVar35 >= sVar10) * sVar10;
  uVar13 = (ushort)(sVar36 < sVar12) * sVar36 | (ushort)(sVar36 >= sVar12) * sVar12;
  uVar16 = (ushort)(sVar37 < sVar15) * sVar37 | (ushort)(sVar37 >= sVar15) * sVar15;
  uVar18 = (ushort)(sVar38 < sVar17) * sVar38 | (ushort)(sVar38 >= sVar17) * sVar17;
  uVar21 = (ushort)(sVar39 < sVar20) * sVar39 | (ushort)(sVar39 >= sVar20) * sVar20;
  uVar23 = (ushort)(sVar40 < sVar22) * sVar40 | (ushort)(sVar40 >= sVar22) * sVar22;
  uVar26 = (ushort)(sVar41 < sVar25) * sVar41 | (ushort)(sVar41 >= sVar25) * sVar25;
  psVar2 = (short *)((long)dest8 * 2);
  *psVar2 = (-1 < (short)uVar8) * uVar8;
  psVar2[1] = (-1 < (short)uVar11) * uVar11;
  psVar2[2] = (-1 < (short)uVar13) * uVar13;
  psVar2[3] = (-1 < (short)uVar16) * uVar16;
  lVar1 = (long)stride * 2 + (long)dest8 * 2;
  *(ushort *)(lVar1 + 8) = (-1 < (short)uVar18) * uVar18;
  *(ushort *)(lVar1 + 10) = (-1 < (short)uVar21) * uVar21;
  *(ushort *)(lVar1 + 0xc) = (-1 < (short)uVar23) * uVar23;
  *(ushort *)(lVar1 + 0xe) = (-1 < (short)uVar26) * uVar26;
  sVar7 = (short)uVar4 + auVar28._0_2_;
  sVar10 = (short)((ulong)uVar4 >> 0x10) + auVar28._2_2_;
  sVar12 = (short)((ulong)uVar4 >> 0x20) + auVar28._4_2_;
  sVar15 = (short)((ulong)uVar4 >> 0x30) + auVar28._6_2_;
  sVar17 = (short)uVar5 + auVar28._8_2_;
  sVar20 = (short)((ulong)uVar5 >> 0x10) + auVar28._10_2_;
  sVar22 = (short)((ulong)uVar5 >> 0x20) + auVar28._12_2_;
  sVar25 = (short)((ulong)uVar5 >> 0x30) + auVar28._14_2_;
  uVar8 = (ushort)(sVar7 < sVar34) * sVar7 | (ushort)(sVar7 >= sVar34) * sVar34;
  uVar11 = (ushort)(sVar10 < sVar35) * sVar10 | (ushort)(sVar10 >= sVar35) * sVar35;
  uVar13 = (ushort)(sVar12 < sVar36) * sVar12 | (ushort)(sVar12 >= sVar36) * sVar36;
  uVar16 = (ushort)(sVar15 < sVar37) * sVar15 | (ushort)(sVar15 >= sVar37) * sVar37;
  uVar18 = (ushort)(sVar17 < sVar38) * sVar17 | (ushort)(sVar17 >= sVar38) * sVar38;
  uVar21 = (ushort)(sVar20 < sVar39) * sVar20 | (ushort)(sVar20 >= sVar39) * sVar39;
  uVar23 = (ushort)(sVar22 < sVar40) * sVar22 | (ushort)(sVar22 >= sVar40) * sVar40;
  uVar26 = (ushort)(sVar25 < sVar41) * sVar25 | (ushort)(sVar25 >= sVar41) * sVar41;
  psVar2 = (short *)(lVar6 + (long)dest8 * 2);
  *psVar2 = (-1 < (short)uVar8) * uVar8;
  psVar2[1] = (-1 < (short)uVar11) * uVar11;
  psVar2[2] = (-1 < (short)uVar13) * uVar13;
  psVar2[3] = (-1 < (short)uVar16) * uVar16;
  lVar3 = lVar3 + (long)dest8 * 2;
  *(ushort *)(lVar3 + 8) = (-1 < (short)uVar18) * uVar18;
  *(ushort *)(lVar3 + 10) = (-1 < (short)uVar21) * uVar21;
  *(ushort *)(lVar3 + 0xc) = (-1 < (short)uVar23) * uVar23;
  *(ushort *)(lVar3 + 0xe) = (-1 < (short)uVar26) * uVar26;
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_sse4_1(const tran_low_t *input, uint8_t *dest8,
                                      int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  __m128i op[4];
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  load_buffer_4x4(input, op);

  // Shift before-hand.
  op[0] = _mm_srai_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_srai_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_srai_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_srai_epi32(op[3], UNIT_QUANT_SHIFT);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i c1 = op[1];
    __m128i d1 = op[2];
    __m128i b1 = op[3];
    a1 = _mm_add_epi32(a1, c1);          // a1 += c1
    d1 = _mm_sub_epi32(d1, b1);          // d1 -= b1
    __m128i e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, b1);  // a1 -= b1
    d1 = _mm_add_epi32(d1, c1);  // d1 += c1

    op[0] = a1;
    op[1] = b1;
    op[2] = c1;
    op[3] = d1;
    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  // Convert to int16_t. The C code checks that we are in range.
  op[0] = _mm_packs_epi32(op[0], op[1]);
  op[1] = _mm_packs_epi32(op[2], op[3]);

  // Load uint16_t.
  __m128i dst[2];
  __m128i tmp[4];
  tmp[0] = _mm_loadl_epi64((const __m128i *)(dest + 0 * stride));
  tmp[1] = _mm_loadl_epi64((const __m128i *)(dest + 1 * stride));
  dst[0] = _mm_unpacklo_epi64(tmp[0], tmp[1]);
  tmp[2] = _mm_loadl_epi64((const __m128i *)(dest + 2 * stride));
  tmp[3] = _mm_loadl_epi64((const __m128i *)(dest + 3 * stride));
  dst[1] = _mm_unpacklo_epi64(tmp[2], tmp[3]);

  // Add to the previous results.
  dst[0] = _mm_add_epi16(dst[0], op[0]);
  dst[1] = _mm_add_epi16(dst[1], op[1]);

  // Clamp.
  dst[0] = highbd_clamp_epi16(dst[0], bd);
  dst[1] = highbd_clamp_epi16(dst[1], bd);

  // Store.
  _mm_storel_epi64((__m128i *)(dest + 0 * stride), dst[0]);
  dst[0] = _mm_srli_si128(dst[0], 8);
  _mm_storel_epi64((__m128i *)(dest + 1 * stride), dst[0]);
  _mm_storel_epi64((__m128i *)(dest + 2 * stride), dst[1]);
  dst[1] = _mm_srli_si128(dst[1], 8);
  _mm_storel_epi64((__m128i *)(dest + 3 * stride), dst[1]);
}